

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall
Darts::Details::DawgBuilder::find_unit(DawgBuilder *this,id_type id,id_type *hash_id)

{
  id_type iVar1;
  size_t sVar2;
  uint *puVar3;
  id_type unit_id;
  id_type *hash_id_local;
  id_type id_local;
  DawgBuilder *this_local;
  
  iVar1 = hash_unit(this,id);
  sVar2 = AutoPool<unsigned_int>::size(&this->table_);
  *hash_id = (id_type)((ulong)iVar1 % sVar2);
  while( true ) {
    puVar3 = AutoPool<unsigned_int>::operator[](&this->table_,(ulong)*hash_id);
    if (*puVar3 == 0) break;
    iVar1 = *hash_id;
    sVar2 = AutoPool<unsigned_int>::size(&this->table_);
    *hash_id = (id_type)((ulong)(iVar1 + 1) % sVar2);
  }
  return 0;
}

Assistant:

inline id_type DawgBuilder::find_unit(id_type id, id_type *hash_id) const {
  *hash_id = hash_unit(id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    // There must not be the same unit.
  }
  return 0;
}